

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O1

SubprocessResult *
phosg::run_process(SubprocessResult *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *cmd,string *stdin_data,bool check,string *cwd,
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *env,size_t timeout_usecs)

{
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var1;
  __node_base _Var2;
  size_t sVar3;
  __pid_t _Var4;
  int iVar5;
  uint uVar6;
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var7;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var8;
  mapped_type *ppbVar9;
  ssize_t sVar10;
  _Hash_node_base *p_Var11;
  uint *puVar12;
  uint64_t uVar13;
  undefined4 extraout_var;
  runtime_error *this;
  undefined7 in_register_00000009;
  _Hash_node_base _Var14;
  Subprocess *pSVar15;
  int __sig;
  ulong uVar16;
  ulong uVar17;
  pointer __ptr_1;
  _Hash_node_base *p_Var18;
  _Hash_node_base *p_Var19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  _Hash_node_base *p_Var21;
  size_type sVar22;
  Subprocess *__k;
  __node_base _Var23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [12];
  Subprocess sp;
  unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
  write_fd_to_buffer;
  Poll p;
  __buckets_alloc_type __alloc;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  read_fd_to_buffer;
  Subprocess local_168;
  unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
  local_150;
  Poll local_118;
  undefined4 local_fc;
  string local_f8;
  ulong local_d8;
  uint64_t local_d0;
  size_t local_c8;
  string local_c0;
  undefined1 local_a0 [56];
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_fc = (undefined4)CONCAT71(in_register_00000009,check);
  SubprocessResult::SubprocessResult(__return_storage_ptr__);
  local_d0 = now();
  Subprocess::Subprocess(&local_168,cmd,-1,-1,-1,cwd,env);
  make_fd_nonblocking(local_168.stdin_write_fd);
  make_fd_nonblocking(local_168.stdout_read_fd);
  make_fd_nonblocking(local_168.stderr_read_fd);
  iVar5 = local_168.stdin_write_fd;
  local_150._M_h._M_buckets = &local_150._M_h._M_single_bucket;
  local_150._M_h._M_bucket_count = 1;
  local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_150._M_h._M_element_count = 0;
  local_150._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_150._M_h._M_rehash_policy._M_next_resize = 0;
  local_150._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (stdin_data == (string *)0x0) {
    close(local_168.stdin_write_fd);
    pbVar20 = stdin_data;
    goto LAB_00117da0;
  }
  p_Var7 = (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)operator_new(0x20);
  __k = (Subprocess *)(long)iVar5;
  p_Var7->_M_buckets = (__buckets_ptr)0x0;
  *(int *)&p_Var7->_M_bucket_count = iVar5;
  (p_Var7->_M_before_begin)._M_nxt = (_Hash_node_base *)stdin_data;
  p_Var7->_M_element_count = 0;
  uVar16 = (ulong)__k % local_150._M_h._M_bucket_count;
  p_Var18 = local_150._M_h._M_buckets[uVar16];
  p_Var19 = (_Hash_node_base *)0x0;
  if ((p_Var18 != (_Hash_node_base *)0x0) &&
     (p_Var19 = p_Var18, p_Var11 = p_Var18->_M_nxt, iVar5 != *(int *)&p_Var18->_M_nxt[1]._M_nxt)) {
    while (p_Var18 = p_Var11->_M_nxt, p_Var18 != (_Hash_node_base *)0x0) {
      p_Var19 = (_Hash_node_base *)0x0;
      if (((ulong)(long)*(int *)&p_Var18[1]._M_nxt % local_150._M_h._M_bucket_count != uVar16) ||
         (p_Var19 = p_Var11, p_Var11 = p_Var18, iVar5 == *(int *)&p_Var18[1]._M_nxt))
      goto LAB_00117c23;
    }
    p_Var19 = (_Hash_node_base *)0x0;
  }
LAB_00117c23:
  if ((p_Var19 != (_Hash_node_base *)0x0) && (p_Var19->_M_nxt != (_Hash_node_base *)0x0))
  goto LAB_00117d7b;
  auVar24 = ::std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&local_150._M_h._M_rehash_policy,local_150._M_h._M_bucket_count,
                       local_150._M_h._M_element_count);
  pbVar20 = auVar24._8_8_;
  if ((auVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_00117d28;
  if (pbVar20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1)
  goto LAB_00118236;
  __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                  ((new_allocator<std::__detail::_Hash_node_base_*> *)local_a0,(size_type)pbVar20,
                   (void *)0x0);
  memset(__s,0,(long)pbVar20 * 8);
LAB_00117c85:
  _Var14._M_nxt = (_Hash_node_base *)local_150._M_h._M_before_begin._M_nxt;
  local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if ((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)_Var14._M_nxt !=
      (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    uVar16 = 0;
    do {
      p_Var1 = (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(_Var14._M_nxt)->_M_nxt;
      uVar17 = (ulong)(long)(int)*(size_type *)(_Var14._M_nxt + 1) % (ulong)pbVar20;
      if (__s[uVar17] == (_Hash_node_base *)0x0) {
        (_Var14._M_nxt)->_M_nxt = (_Hash_node_base *)local_150._M_h._M_before_begin._M_nxt;
        local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)_Var14._M_nxt;
        __s[uVar17] = (__node_base_ptr)&local_150._M_h._M_before_begin;
        if ((_Var14._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
          pp_Var8 = __s + uVar16;
          goto LAB_00117ce8;
        }
      }
      else {
        (_Var14._M_nxt)->_M_nxt = __s[uVar17]->_M_nxt;
        pp_Var8 = &__s[uVar17]->_M_nxt;
        uVar17 = uVar16;
LAB_00117ce8:
        *pp_Var8 = _Var14._M_nxt;
      }
      _Var14._M_nxt = (_Hash_node_base *)p_Var1;
      uVar16 = uVar17;
    } while (p_Var1 != (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)0x0);
  }
  if (&local_150._M_h._M_single_bucket != local_150._M_h._M_buckets) {
    operator_delete(local_150._M_h._M_buckets,local_150._M_h._M_bucket_count << 3);
  }
  uVar16 = (ulong)__k % (ulong)pbVar20;
  stdin_data = pbVar20;
  local_150._M_h._M_buckets = __s;
  local_150._M_h._M_bucket_count = (size_type)pbVar20;
LAB_00117d28:
  if (local_150._M_h._M_buckets[uVar16] == (_Hash_node_base *)0x0) {
    p_Var7->_M_buckets = (__buckets_ptr)local_150._M_h._M_before_begin._M_nxt;
    if ((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)local_150._M_h._M_before_begin._M_nxt !=
        (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)0x0) {
      local_150._M_h._M_buckets
      [(ulong)(long)(int)*(size_type *)(local_150._M_h._M_before_begin._M_nxt + 1) %
       local_150._M_h._M_bucket_count] = (__node_base_ptr)p_Var7;
    }
    local_150._M_h._M_buckets[uVar16] = (__node_base_ptr)&local_150._M_h._M_before_begin;
    local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var7;
  }
  else {
    p_Var7->_M_buckets = &local_150._M_h._M_buckets[uVar16]->_M_nxt->_M_nxt;
    local_150._M_h._M_buckets[uVar16]->_M_nxt = (_Hash_node_base *)p_Var7;
  }
  local_150._M_h._M_element_count = local_150._M_h._M_element_count + 1;
  p_Var7 = (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)0x0;
LAB_00117d7b:
  if (p_Var7 != (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)0x0) {
    operator_delete(p_Var7,0x20);
  }
  Poll::add(&local_118,local_168.stdin_write_fd,4);
  pbVar20 = stdin_data;
LAB_00117da0:
  local_f8._M_dataplus._M_p._0_4_ = local_168.stdout_read_fd;
  local_a0._0_8_ = __return_storage_ptr__;
  ::std::
  _Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<int,std::__cxx11::string*>
            ((_Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_68);
  Poll::add(&local_118,local_168.stdout_read_fd,1);
  local_f8._M_dataplus._M_p._0_4_ = local_168.stderr_read_fd;
  local_a0._0_8_ = &__return_storage_ptr__->stderr_contents;
  ::std::
  _Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<int,std::__cxx11::string*>
            ((_Hashtable<int,std::pair<int_const,std::__cxx11::string*>,std::allocator<std::pair<int_const,std::__cxx11::string*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_68);
  Poll::add(&local_118,local_168.stderr_read_fd,1);
  local_d8 = 0;
  p_Var7 = &local_68;
  local_c8 = timeout_usecs;
LAB_00117e4c:
  _Var4 = Subprocess::wait(&local_168,(void *)0x1);
  __return_storage_ptr__->exit_status = _Var4;
  if (_Var4 != -1) {
    uVar13 = now();
    __return_storage_ptr__->elapsed_time = uVar13 - __return_storage_ptr__->elapsed_time;
    _Var23._M_nxt = local_68._M_before_begin._M_nxt;
    goto LAB_001180d8;
  }
  Poll::poll((Poll *)local_a0,(pollfd *)&local_118,1000,(int)__return_storage_ptr__);
  p_Var18 = (_Hash_node_base *)local_a0._16_8_;
LAB_00117e89:
  if (p_Var18 == (_Hash_node_base *)0x0) goto LAB_00118039;
  __k = (Subprocess *)(p_Var18 + 1);
  if (((ulong)p_Var18[1]._M_nxt & 0x100000000) == 0) {
LAB_00117f1b:
    if (((ulong)p_Var18[1]._M_nxt & 0x400000000) != 0) {
      iVar5 = __k->stdin_write_fd;
      p_Var19 = local_150._M_h._M_buckets[(ulong)(long)iVar5 % local_150._M_h._M_bucket_count];
      p_Var11 = (_Hash_node_base *)0x0;
      if ((p_Var19 != (_Hash_node_base *)0x0) &&
         (p_Var11 = p_Var19, p_Var21 = p_Var19->_M_nxt, iVar5 != *(int *)&p_Var19->_M_nxt[1]._M_nxt)
         ) {
        while (p_Var19 = p_Var21->_M_nxt, p_Var19 != (_Hash_node_base *)0x0) {
          p_Var11 = (_Hash_node_base *)0x0;
          if (((ulong)(long)*(int *)&p_Var19[1]._M_nxt % local_150._M_h._M_bucket_count !=
               (ulong)(long)iVar5 % local_150._M_h._M_bucket_count) ||
             (p_Var11 = p_Var21, p_Var21 = p_Var19, iVar5 == *(int *)&p_Var19[1]._M_nxt))
          goto LAB_00117fa9;
        }
        p_Var11 = (_Hash_node_base *)0x0;
      }
LAB_00117fa9:
      if (p_Var11 == (_Hash_node_base *)0x0) {
        p_Var19 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var19 = p_Var11->_M_nxt;
      }
      if (p_Var19 == (_Hash_node_base *)0x0) goto LAB_0011822a;
      sVar10 = write(iVar5,(void *)((long)&(p_Var19[2]._M_nxt)->_M_nxt->_M_nxt +
                                   (long)&(p_Var19[3]._M_nxt)->_M_nxt),
                     (long)p_Var19[2]._M_nxt[1]._M_nxt - (long)p_Var19[3]._M_nxt);
      if (sVar10 < 1) {
        pSVar15 = __k;
        if (-1 < sVar10) goto LAB_00117ff9;
        puVar12 = (uint *)__errno_location();
        if ((*puVar12 != 4) && (*puVar12 != 0xb)) {
          auVar25 = __cxa_allocate_exception(0x10);
          string_for_error_abi_cxx11_(&local_c0,(phosg *)(ulong)*puVar12,auVar25._8_4_);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f8,"write failed: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0);
          ::std::runtime_error::runtime_error(auVar25._0_8_,(string *)&local_f8);
          __cxa_throw(auVar25._0_8_,&::std::runtime_error::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
      }
      else {
        p_Var11 = (_Hash_node_base *)((long)&(p_Var19[3]._M_nxt)->_M_nxt + sVar10);
        p_Var19[3]._M_nxt = p_Var11;
        pSVar15 = &local_168;
        if (p_Var11 == p_Var19[2]._M_nxt[1]._M_nxt) {
LAB_00117ff9:
          Poll::remove(&local_118,(char *)(ulong)(uint)pSVar15->stdin_write_fd);
          ::std::
          unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
          ::erase(&local_150,(key_type *)__k);
        }
      }
    }
  }
  else {
    ppbVar9 = ::std::__detail::
              _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)p_Var7,(key_type *)__k);
    pbVar20 = *ppbVar9;
    sVar22 = pbVar20->_M_string_length;
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (pbVar20,sVar22 + 0x20000,'\0');
    sVar10 = ::read(__k->stdin_write_fd,(pbVar20->_M_dataplus)._M_p + sVar22,0x20000);
    if (0 < sVar10) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (pbVar20,sVar10 + sVar22,'\0');
      goto LAB_00117f1b;
    }
    if (-1 < sVar10) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (pbVar20,sVar22,'\0');
      Poll::remove(&local_118,(char *)(ulong)(uint)__k->stdin_write_fd);
      ::std::
      _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(p_Var7,__k);
      goto LAB_00117f1b;
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (pbVar20,sVar22,'\0');
    puVar12 = (uint *)__errno_location();
    if ((*puVar12 != 4) && (*puVar12 != 0xb)) {
      auVar25 = __cxa_allocate_exception(0x10);
      string_for_error_abi_cxx11_(&local_c0,(phosg *)(ulong)*puVar12,auVar25._8_4_);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f8,"read failed: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c0);
      ::std::runtime_error::runtime_error(auVar25._0_8_,(string *)&local_f8);
      __cxa_throw(auVar25._0_8_,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  p_Var18 = p_Var18->_M_nxt;
  goto LAB_00117e89;
LAB_001180d8:
  if (_Var23._M_nxt == (_Hash_node_base *)0x0) {
    if (((char)local_fc != '\0') && (_Var4 = Subprocess::wait(&local_168,(void *)0x0), _Var4 != 0))
    {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar6 = Subprocess::wait(&local_168,(void *)0x0);
      string_printf_abi_cxx11_
                ((string *)local_a0,"command returned code %d\nstdout:\n%s\nstderr:\n%s",
                 (ulong)uVar6,(__return_storage_ptr__->stdout_contents)._M_dataplus._M_p,
                 (__return_storage_ptr__->stderr_contents)._M_dataplus._M_p);
      ::std::runtime_error::runtime_error(this,(string *)local_a0);
      __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((pollfd)local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                super__Vector_impl_data._M_start != (pollfd)0x0) {
      operator_delete(local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    _Var2._M_nxt = local_150._M_h._M_before_begin._M_nxt;
    while ((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)_Var2._M_nxt !=
           (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)0x0) {
      p_Var7 = (_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)((_Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)_Var2._M_nxt)->_M_buckets;
      operator_delete(_Var2._M_nxt,0x20);
      _Var2._M_nxt = (_Hash_node_base *)p_Var7;
    }
    memset(local_150._M_h._M_buckets,0,local_150._M_h._M_bucket_count << 3);
    local_150._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_150._M_h._M_element_count = 0;
    if (&local_150._M_h._M_single_bucket != local_150._M_h._M_buckets) {
      operator_delete(local_150._M_h._M_buckets,local_150._M_h._M_bucket_count << 3);
    }
    Subprocess::~Subprocess(&local_168);
    return __return_storage_ptr__;
  }
  do {
    sVar22 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             _Var23._M_nxt[2]._M_nxt)->_M_string_length;
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               _Var23._M_nxt[2]._M_nxt,sVar22 + 0x20000,'\0');
    sVar10 = ::read(*(int *)&_Var23._M_nxt[1]._M_nxt,
                    (void *)((long)&(_Var23._M_nxt[2]._M_nxt)->_M_nxt->_M_nxt + sVar22),0x20000);
    if (sVar10 < 1) {
      pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                _Var23._M_nxt[2]._M_nxt;
      if (-1 < sVar10) goto LAB_00118132;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (pbVar20,sVar22,'\0');
      puVar12 = (uint *)__errno_location();
      if ((*puVar12 != 4) && (*puVar12 != 0xb)) {
        auVar25 = __cxa_allocate_exception(0x10);
        string_for_error_abi_cxx11_(&local_f8,(phosg *)(ulong)*puVar12,auVar25._8_4_);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,"read failed: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_f8);
        ::std::runtime_error::runtime_error(auVar25._0_8_,(string *)local_a0);
        __cxa_throw(auVar25._0_8_,&::std::runtime_error::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
    }
    else {
      pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                _Var23._M_nxt[2]._M_nxt;
      sVar22 = (sVar10 + pbVar20->_M_string_length) - 0x20000;
LAB_00118132:
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (pbVar20,sVar22,'\0');
    }
  } while (0 < sVar10);
  _Var23._M_nxt = (_Var23._M_nxt)->_M_nxt;
  goto LAB_001180d8;
LAB_00118039:
  std::
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_a0);
  sVar3 = local_c8;
  if (local_c8 == 0) {
    local_c8 = 0;
  }
  else {
    uVar13 = now();
    if (local_d0 < uVar13 - sVar3) {
      if ((local_d8 & 1) == 0) {
        iVar5 = Subprocess::kill(&local_168,0xf,__sig);
        local_d8 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
        local_d0 = now();
        local_c8 = 5000000;
      }
      else {
        Subprocess::kill(&local_168,9,__sig);
      }
    }
  }
  goto LAB_00117e4c;
LAB_0011822a:
  ::std::__throw_out_of_range("_Map_base::at");
LAB_00118236:
  local_150._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __s = &local_150._M_h._M_single_bucket;
  goto LAB_00117c85;
}

Assistant:

SubprocessResult run_process(const vector<string>& cmd, const string* stdin_data,
    bool check, const std::string* cwd,
    const std::unordered_map<std::string, std::string>* env,
    size_t timeout_usecs) {
  SubprocessResult ret;
  bool terminated = false;
  uint64_t start_time = now();

  Subprocess sp(cmd, -1, -1, -1, cwd, env);

  make_fd_nonblocking(sp.stdin_fd());
  make_fd_nonblocking(sp.stdout_fd());
  make_fd_nonblocking(sp.stderr_fd());

  struct Buffer {
    const string* buf;
    size_t offset;
    Buffer(const string* buf) : buf(buf), offset(0) {}
  };
  unordered_map<int, Buffer> write_fd_to_buffer;
  unordered_map<int, string*> read_fd_to_buffer;

  Poll p;
  if (stdin_data) {
    write_fd_to_buffer.emplace(sp.stdin_fd(), stdin_data);
    p.add(sp.stdin_fd(), POLLOUT);
  } else {
    close(sp.stdin_fd());
  }
  read_fd_to_buffer.emplace(sp.stdout_fd(), &ret.stdout_contents);
  p.add(sp.stdout_fd(), POLLIN);
  read_fd_to_buffer.emplace(sp.stderr_fd(), &ret.stderr_contents);
  p.add(sp.stderr_fd(), POLLIN);

  // Read and write to pipes as long as the process is running
  while ((ret.exit_status = sp.wait(true)) == -1) {
    for (const auto& pfd : p.poll(1000)) {
      if (pfd.second & POLLIN) {
        string* buf = read_fd_to_buffer.at(pfd.first);
        size_t read_offset = buf->size();
        buf->resize(read_offset + READ_BLOCK_SIZE);
        ssize_t bytes_read = ::read(pfd.first, buf->data() + read_offset, READ_BLOCK_SIZE);
        if (bytes_read > 0) {
          buf->resize(read_offset + bytes_read);
        } else if (bytes_read < 0) {
          buf->resize(read_offset);
          if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
            continue;
          }
          throw runtime_error("read failed: " + string_for_error(errno));
        } else { // bytes_read == 0; usually means the pipe is broken
          buf->resize(read_offset);
          p.remove(pfd.first, true);
          read_fd_to_buffer.erase(pfd.first);
        }
      }
      if (pfd.second & POLLOUT) {
        auto& buf = write_fd_to_buffer.at(pfd.first);
        size_t bytes_to_write = buf.buf->size() - buf.offset;
        ssize_t bytes_written = write(pfd.first,
            buf.buf->data() + buf.offset, bytes_to_write);
        if (bytes_written > 0) {
          buf.offset += bytes_written;
          if (buf.offset == buf.buf->size()) {
            p.remove(sp.stdin_fd(), true);
            write_fd_to_buffer.erase(pfd.first);
          }
        } else if (bytes_written < 0) {
          if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
            continue;
          }
          throw runtime_error("write failed: " + string_for_error(errno));
        } else { // bytes_written == 0; usually means the pipe is broken
          p.remove(pfd.first, true);
          write_fd_to_buffer.erase(pfd.first);
        }
      }
    }

    if (timeout_usecs && (start_time < now() - timeout_usecs)) {
      if (!terminated) {
        sp.kill(SIGTERM);
        terminated = true;
        timeout_usecs = 5000000;
        start_time = now();
      } else {
        sp.kill(SIGKILL);
      }
    }
  }
  ret.elapsed_time = now() - ret.elapsed_time;

  // Read any leftover data after termination
  for (auto& it : read_fd_to_buffer) {
    for (;;) {
      size_t read_offset = it.second->size();
      it.second->resize(read_offset + READ_BLOCK_SIZE);
      ssize_t bytes_read = ::read(it.first, it.second->data() + read_offset, READ_BLOCK_SIZE);
      if (bytes_read > 0) {
        it.second->resize(it.second->size() - READ_BLOCK_SIZE + bytes_read);
      } else if (bytes_read < 0) {
        it.second->resize(read_offset);
        if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
          break;
        }
        throw runtime_error("read failed: " + string_for_error(errno));
      } else { // bytes_read == 0; usually means the pipe is broken
        it.second->resize(read_offset);
        break;
      }
    }
  }

  if (check && sp.wait()) {
    throw runtime_error(string_printf("command returned code %d\nstdout:\n%s\nstderr:\n%s",
        sp.wait(), ret.stdout_contents.c_str(), ret.stderr_contents.c_str()));
  }

  return ret;
}